

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Endpoints.cpp
# Opt level: O2

bool soul::isParameterInput(EndpointDetails *details)

{
  bool bVar1;
  EndpointType EVar2;
  Type *pTVar3;
  allocator<char> local_39;
  string local_38;
  
  EVar2 = details->endpointType;
  if (EVar2 == stream) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"name",&local_39);
    bVar1 = Annotation::hasValue(&details->annotation,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    if (bVar1) {
      return true;
    }
    EVar2 = details->endpointType;
  }
  else if (EVar2 == event) {
    bVar1 = isConsoleEndpoint(&details->name);
    if (bVar1) {
      return false;
    }
    if ((details->dataTypes).numActive != 1) {
      return false;
    }
    pTVar3 = ArrayWithPreallocation<choc::value::Type,_2UL>::front(&details->dataTypes);
    return pTVar3->mainType == boolean || ((pTVar3->mainType & 0xef) - int32 & 0xfb) == 0;
  }
  if (EVar2 == value) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"name",&local_39);
    bVar1 = Annotation::hasValue(&details->annotation,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool isParameterInput (const EndpointDetails& details)
{
    if (isEvent (details))
    {
        if (isConsoleEndpoint (details.name))
            return false;

        if (details.dataTypes.size() != 1)
            return false;

        return details.dataTypes.front().isPrimitive();
    }

    if (isStream (details) && details.annotation.hasValue ("name"))
        return true;

    if (isValue (details) && details.annotation.hasValue ("name"))
        return true;

    return false;
}